

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O3

decNumber_conflict *
decNumberMultiply(decNumber_conflict *res,decNumber_conflict *lhs,decNumber_conflict *rhs,
                 decContext *set)

{
  uint32_t status;
  uint32_t local_1c;
  
  local_1c = 0;
  decMultiplyOp(res,lhs,rhs,set,&local_1c);
  if (local_1c != 0) {
    decStatus(res,local_1c,set);
  }
  return res;
}

Assistant:

decNumber * decNumberMultiply(decNumber *res, const decNumber *lhs,
			      const decNumber *rhs, decContext *set) {
  uInt status=0;		   /* accumulator */
  decMultiplyOp(res, lhs, rhs, set, &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }